

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns_constraints.c
# Opt level: O3

int fQB(sunrealtype t,N_Vector y,N_Vector yB,N_Vector qBdot,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  
  pdVar5 = *(double **)((long)y->content + 0x10);
  pdVar6 = *(double **)((long)yB->content + 0x10);
  dVar1 = pdVar6[1];
  dVar2 = pdVar6[2];
  dVar7 = dVar1 - *pdVar6;
  dVar3 = pdVar5[1];
  pdVar6 = *(double **)((long)qBdot->content + 0x10);
  dVar4 = pdVar5[2];
  *pdVar6 = dVar7 * *pdVar5;
  pdVar6[1] = dVar7 * -dVar3 * dVar4;
  pdVar6[2] = dVar3 * dVar3 * (dVar2 - dVar1);
  return 0;
}

Assistant:

static int fQB(sunrealtype t, N_Vector y, N_Vector yB, N_Vector qBdot,
               void* user_dataB)
{
  sunrealtype y1, y2, y3;
  sunrealtype l1, l2, l3;
  sunrealtype l21, l32, y23;

  /* The y vector */
  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  /* The lambda vector */
  l1 = Ith(yB, 1);
  l2 = Ith(yB, 2);
  l3 = Ith(yB, 3);

  /* Temporary variables */
  l21 = l2 - l1;
  l32 = l3 - l2;
  y23 = y2 * y3;

  Ith(qBdot, 1) = y1 * l21;
  Ith(qBdot, 2) = -y23 * l21;
  Ith(qBdot, 3) = y2 * y2 * l32;

  return (0);
}